

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregate_hashtable.cpp
# Opt level: O2

void __thiscall
duckdb::GroupedAggregateHashTable::InitializeUnpartitionedData(GroupedAggregateHashTable *this)

{
  shared_ptr<duckdb::TupleDataLayout,_true> *this_00;
  BufferManager *args;
  _Head_base<0UL,_duckdb::PartitionedTupleData_*,_false> _Var1;
  _Head_base<0UL,_duckdb::PartitionedTupleData_*,_false> _Var2;
  pointer pPVar3;
  TupleDataLayout *pTVar4;
  _Head_base<0UL,_duckdb::PartitionedTupleData_*,_false> local_48;
  unsigned_long local_40;
  unsigned_long_long local_38;
  
  if ((this->unpartitioned_data).
      super_unique_ptr<duckdb::PartitionedTupleData,_std::default_delete<duckdb::PartitionedTupleData>_>
      ._M_t.
      super___uniq_ptr_impl<duckdb::PartitionedTupleData,_std::default_delete<duckdb::PartitionedTupleData>_>
      ._M_t.
      super__Tuple_impl<0UL,_duckdb::PartitionedTupleData_*,_std::default_delete<duckdb::PartitionedTupleData>_>
      .super__Head_base<0UL,_duckdb::PartitionedTupleData_*,_false>._M_head_impl ==
      (PartitionedTupleData *)0x0) {
    args = (this->super_BaseAggregateHashTable).buffer_manager;
    this_00 = &(this->super_BaseAggregateHashTable).layout_ptr;
    local_38 = 0;
    pTVar4 = shared_ptr<duckdb::TupleDataLayout,_true>::operator->(this_00);
    local_40 = ((long)(pTVar4->types).
                      super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                      super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                      _M_impl.super__Vector_impl_data._M_finish -
               (long)(pTVar4->types).
                     super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                     super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                     _M_impl.super__Vector_impl_data._M_start) / 0x18 - 1;
    make_uniq<duckdb::RadixPartitionedTupleData,duckdb::BufferManager&,duckdb::shared_ptr<duckdb::TupleDataLayout,true>&,unsigned_long_long,unsigned_long>
              ((duckdb *)&local_48,args,this_00,&local_38,&local_40);
    _Var2._M_head_impl = local_48._M_head_impl;
    local_48._M_head_impl = (PartitionedTupleData *)0x0;
    _Var1._M_head_impl =
         (this->unpartitioned_data).
         super_unique_ptr<duckdb::PartitionedTupleData,_std::default_delete<duckdb::PartitionedTupleData>_>
         ._M_t.
         super___uniq_ptr_impl<duckdb::PartitionedTupleData,_std::default_delete<duckdb::PartitionedTupleData>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::PartitionedTupleData_*,_std::default_delete<duckdb::PartitionedTupleData>_>
         .super__Head_base<0UL,_duckdb::PartitionedTupleData_*,_false>._M_head_impl;
    (this->unpartitioned_data).
    super_unique_ptr<duckdb::PartitionedTupleData,_std::default_delete<duckdb::PartitionedTupleData>_>
    ._M_t.
    super___uniq_ptr_impl<duckdb::PartitionedTupleData,_std::default_delete<duckdb::PartitionedTupleData>_>
    ._M_t.
    super__Tuple_impl<0UL,_duckdb::PartitionedTupleData_*,_std::default_delete<duckdb::PartitionedTupleData>_>
    .super__Head_base<0UL,_duckdb::PartitionedTupleData_*,_false>._M_head_impl = _Var2._M_head_impl;
    if (_Var1._M_head_impl != (PartitionedTupleData *)0x0) {
      (**(code **)((long)(_Var1._M_head_impl)->_vptr_PartitionedTupleData + 8))();
      if (local_48._M_head_impl != (PartitionedTupleData *)0x0) {
        (*(local_48._M_head_impl)->_vptr_PartitionedTupleData[1])();
      }
    }
  }
  else {
    pPVar3 = unique_ptr<duckdb::PartitionedTupleData,_std::default_delete<duckdb::PartitionedTupleData>,_true>
             ::operator->(&this->unpartitioned_data);
    PartitionedTupleData::Reset(pPVar3);
  }
  pPVar3 = unique_ptr<duckdb::PartitionedTupleData,_std::default_delete<duckdb::PartitionedTupleData>,_true>
           ::operator->(&this->unpartitioned_data);
  PartitionedTupleData::InitializeAppendState
            (pPVar3,&(this->state).unpartitioned_append_state,KEEP_EVERYTHING_PINNED);
  return;
}

Assistant:

void GroupedAggregateHashTable::InitializeUnpartitionedData() {
	D_ASSERT(radix_bits >= UNPARTITIONED_RADIX_BITS_THRESHOLD);
	if (!unpartitioned_data) {
		unpartitioned_data =
		    make_uniq<RadixPartitionedTupleData>(buffer_manager, layout_ptr, 0ULL, layout_ptr->ColumnCount() - 1);
	} else {
		unpartitioned_data->Reset();
	}
	unpartitioned_data->InitializeAppendState(state.unpartitioned_append_state,
	                                          TupleDataPinProperties::KEEP_EVERYTHING_PINNED);
}